

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_state.cpp
# Opt level: O3

bool __thiscall
spvtools::val::ValidationState_t::EvalConstantValUint64
          (ValidationState_t *this,uint32_t id,uint64_t *val)

{
  long *plVar1;
  long lVar2;
  bool bVar3;
  const_iterator cVar4;
  ulong uVar5;
  long lVar6;
  uint32_t local_20;
  key_type_conflict local_1c;
  
  local_20 = id;
  cVar4 = std::
          _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::val::Instruction_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::val::Instruction_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->all_definitions_)._M_h,&local_20);
  if ((cVar4.
       super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::val::Instruction_*>,_false>
       ._M_cur == (__node_type *)0x0) ||
     (plVar1 = *(long **)((long)cVar4.
                                super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::val::Instruction_*>,_false>
                                ._M_cur + 0x10), plVar1 == (long *)0x0)) {
    __assert_fail("0 && \"Instruction not found\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validation_state.cpp"
                  ,0x55e,
                  "bool spvtools::val::ValidationState_t::EvalConstantValUint64(uint32_t, uint64_t *) const"
                 );
  }
  local_1c = *(key_type_conflict *)(plVar1 + 8);
  cVar4 = std::
          _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::val::Instruction_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::val::Instruction_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->all_definitions_)._M_h,&local_1c);
  if (((cVar4.
        super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::val::Instruction_*>,_false>
        ._M_cur == (__node_type *)0x0) ||
      (*(long *)((long)cVar4.
                       super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::val::Instruction_*>,_false>
                       ._M_cur + 0x10) == 0)) ||
     (*(short *)(*(long *)((long)cVar4.
                                 super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::val::Instruction_*>,_false>
                                 ._M_cur + 0x10) + 0x3a) != 0x15)) {
LAB_00305b40:
    bVar3 = false;
  }
  else {
    if (*(short *)((long)plVar1 + 0x3a) == 0x2b) {
      lVar2 = *plVar1;
      lVar6 = plVar1[1] - lVar2 >> 2;
      if (lVar6 == 5) {
        uVar5 = *(ulong *)(lVar2 + 0xc);
      }
      else {
        if (lVar6 != 4) {
          __assert_fail("inst->words().size() == 5",
                        "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validation_state.cpp"
                        ,0x56d,
                        "bool spvtools::val::ValidationState_t::EvalConstantValUint64(uint32_t, uint64_t *) const"
                       );
        }
        uVar5 = (ulong)*(uint *)(lVar2 + 0xc);
      }
      *val = uVar5;
    }
    else {
      if (*(short *)((long)plVar1 + 0x3a) != 0x2e) goto LAB_00305b40;
      *val = 0;
    }
    bVar3 = true;
  }
  return bVar3;
}

Assistant:

bool ValidationState_t::EvalConstantValUint64(uint32_t id,
                                              uint64_t* val) const {
  const Instruction* inst = FindDef(id);
  if (!inst) {
    assert(0 && "Instruction not found");
    return false;
  }

  if (!IsIntScalarType(inst->type_id())) return false;

  if (inst->opcode() == spv::Op::OpConstantNull) {
    *val = 0;
  } else if (inst->opcode() != spv::Op::OpConstant) {
    // Spec constant values cannot be evaluated so don't consider constant for
    // static validation
    return false;
  } else if (inst->words().size() == 4) {
    *val = inst->word(3);
  } else {
    assert(inst->words().size() == 5);
    *val = inst->word(3);
    *val |= uint64_t(inst->word(4)) << 32;
  }
  return true;
}